

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderStandalone(xmlTextReaderPtr reader)

{
  xmlDocPtr local_20;
  xmlDocPtr doc;
  xmlTextReaderPtr reader_local;
  
  local_20 = (xmlDocPtr)0x0;
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else {
    if (reader->doc == (xmlDocPtr)0x0) {
      if (reader->ctxt != (xmlParserCtxtPtr)0x0) {
        local_20 = reader->ctxt->myDoc;
      }
    }
    else {
      local_20 = reader->doc;
    }
    if (local_20 == (xmlDocPtr)0x0) {
      reader_local._4_4_ = -1;
    }
    else {
      reader_local._4_4_ = local_20->standalone;
    }
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderStandalone(xmlTextReaderPtr reader) {
    xmlDocPtr doc = NULL;
    if (reader == NULL)
	return(-1);
    if (reader->doc != NULL)
        doc = reader->doc;
    else if (reader->ctxt != NULL)
	doc = reader->ctxt->myDoc;
    if (doc == NULL)
	return(-1);

    return(doc->standalone);
}